

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_bfset_32_ai(void)

{
  uint uVar1;
  sbyte sVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar3 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar3 = pmmu_translate_addr(uVar3);
  }
  uVar3 = m68k_read_memory_16(uVar3 & m68ki_cpu.address_mask);
  if ((uVar3 >> 0xb & 1) == 0) {
    uVar8 = uVar3 >> 6 & 0x1f;
  }
  else {
    uVar8 = m68ki_cpu.dar[uVar3 >> 6 & 7];
  }
  if ((uVar3 & 0x20) != 0) {
    uVar3 = m68ki_cpu.dar[uVar3 & 7];
  }
  uVar5 = uVar8 + 7;
  if (-1 < (int)uVar8) {
    uVar5 = uVar8;
  }
  uVar4 = ((int)uVar5 >> 3) + m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] + -1 +
          (uint)((uVar8 & 0x80000007) < 0x80000001);
  uVar7 = uVar3 - 1 & 0x1f;
  uVar5 = -1 << (~(byte)uVar7 & 0x1f);
  sVar2 = (sbyte)(uVar8 & 7);
  uVar6 = uVar5 >> sVar2;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar3 = uVar4;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar3 = pmmu_translate_addr(uVar4);
  }
  uVar1 = m68k_read_memory_32(uVar3 & m68ki_cpu.address_mask);
  m68ki_cpu.n_flag = (uVar1 << sVar2) >> 0x18;
  m68ki_cpu.not_z_flag = uVar1 & uVar6;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  uVar3 = uVar4;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar3 = pmmu_translate_addr(uVar4);
  }
  m68k_write_memory_32(uVar3 & m68ki_cpu.address_mask,uVar1 | uVar6);
  if (0x20 < (uVar8 & 7) + uVar7 + 1) {
    uVar4 = uVar4 + 4;
    my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
    uVar3 = uVar4;
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar3 = pmmu_translate_addr(uVar4);
    }
    uVar6 = m68k_read_memory_8(uVar3 & m68ki_cpu.address_mask);
    uVar5 = uVar5 & 0xff;
    m68ki_cpu.not_z_flag = m68ki_cpu.not_z_flag | uVar6 & uVar5;
    my_fc_handler(m68ki_cpu.s_flag | 1);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar4 = pmmu_translate_addr(uVar4);
    }
    m68k_write_memory_8(uVar4 & m68ki_cpu.address_mask,uVar6 | uVar5);
    return;
  }
  return;
}

Assistant:

static void m68k_op_bfset_32_ai(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint offset = (word2>>6)&31;
		uint width = word2;
		uint mask_base;
		uint data_long;
		uint mask_long;
		uint data_byte = 0;
		uint mask_byte = 0;
		uint ea = EA_AY_AI_8();


		if(BIT_B(word2))
			offset = MAKE_INT_32(REG_D[offset&7]);
		if(BIT_5(word2))
			width = REG_D[width&7];

		/* Offset is signed so we have to use ugly math =( */
		ea += offset / 8;
		offset %= 8;
		if(offset < 0)
		{
			offset += 8;
			ea--;
		}
		width = ((width-1) & 31) + 1;


		mask_base = MASK_OUT_ABOVE_32(0xffffffff << (32 - width));
		mask_long = mask_base >> offset;

		data_long = m68ki_read_32(ea);
		FLAG_N = NFLAG_32(data_long << offset);
		FLAG_Z = data_long & mask_long;
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;

		m68ki_write_32(ea, data_long | mask_long);

		if((width + offset) > 32)
		{
			mask_byte = MASK_OUT_ABOVE_8(mask_base);
			data_byte = m68ki_read_8(ea+4);
			FLAG_Z |= (data_byte & mask_byte);
			m68ki_write_8(ea+4, data_byte | mask_byte);
		}
		return;
	}
	m68ki_exception_illegal();
}